

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aperiodicity_extraction_by_world.cc
# Opt level: O0

bool __thiscall
sptk::AperiodicityExtractionByWorld::Run
          (AperiodicityExtractionByWorld *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *aperiodicity)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference this_00;
  int iVar5;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  double dVar6;
  int unaff_retaddr;
  D4COption *in_stack_00000008;
  double **in_stack_00000010;
  vector<double,_std::allocator<double>_> *vector;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1;
  vector<double_*,_std::allocator<double_*>_> pointers;
  int i_2;
  int length;
  D4COption option;
  int i_1;
  vector<double,_std::allocator<double>_> time_axis;
  double frame_shift_in_sec;
  int i;
  double nyquist_frequency;
  int f0_length;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  vector<double_*,_std::allocator<double_*>_> *in_stack_fffffffffffffec0;
  allocator_type *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  vector<double_*,_std::allocator<double_*>_> *in_stack_fffffffffffffef0;
  __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  local_b0 [5];
  int local_88;
  int local_84;
  D4COption local_80;
  int local_78;
  vector<double,_std::allocator<double>_> local_60;
  double local_48;
  int local_3c;
  double dVar7;
  int f0_length_00;
  undefined4 in_stack_ffffffffffffffd0;
  
  if (((((*(byte *)(in_RDI + 0x18) & 1) != 0) &&
       (bVar1 = std::vector<double,_std::allocator<double>_>::empty
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0),
       !bVar1)) &&
      (bVar1 = std::vector<double,_std::allocator<double>_>::empty
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0),
      !bVar1)) &&
     (in_RCX != (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)0x0)) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    iVar5 = (int)sVar2;
    local_3c = 0;
    dVar7 = *(double *)(in_RDI + 0x10) * 0.5;
    while( true ) {
      if (iVar5 <= local_3c) {
        local_48 = (double)*(int *)(in_RDI + 0xc) / *(double *)(in_RDI + 0x10);
        std::allocator<double>::allocator((allocator<double> *)0x10bdc4);
        std::vector<double,_std::allocator<double>_>::vector
                  (in_stack_fffffffffffffee0,
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   in_stack_fffffffffffffed0);
        std::allocator<double>::~allocator((allocator<double> *)0x10bdea);
        for (local_78 = 0; local_78 < iVar5; local_78 = local_78 + 1) {
          dVar6 = (double)local_78 * local_48;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_60,(long)local_78);
          *pvVar4 = dVar6;
        }
        world::InitializeD4COption(&local_80);
        local_80.threshold = 0.0;
        sVar2 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::size(in_RCX);
        if (sVar2 != (long)iVar5) {
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_fffffffffffffee0,
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        }
        local_84 = *(int *)(in_RDI + 8) / 2 + 1;
        for (local_88 = 0; local_88 < iVar5; local_88 = local_88 + 1) {
          this_00 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](in_RCX,(long)local_88);
          sVar2 = std::vector<double,_std::allocator<double>_>::size(this_00);
          if (sVar2 != (long)local_84) {
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[](in_RCX,(long)local_88);
            std::vector<double,_std::allocator<double>_>::resize
                      (in_stack_fffffffffffffee0,
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          }
        }
        std::vector<double_*,_std::allocator<double_*>_>::vector
                  ((vector<double_*,_std::allocator<double_*>_> *)0x10bf8b);
        std::vector<double_*,_std::allocator<double_*>_>::reserve
                  (in_stack_fffffffffffffef0,
                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        local_b0[0]._M_current =
             (vector<double,_std::allocator<double>_> *)
             std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                              *)in_stack_fffffffffffffec0,
                             (__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          f0_length_00 = (int)((ulong)dVar7 >> 0x20);
          if (!bVar1) break;
          __gnu_cxx::
          __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
          ::operator*(local_b0);
          std::vector<double,_std::allocator<double>_>::data
                    ((vector<double,_std::allocator<double>_> *)0x10c016);
          std::vector<double_*,_std::allocator<double_*>_>::push_back
                    (in_stack_fffffffffffffec0,
                     (value_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          __gnu_cxx::
          __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
          ::operator++(local_b0);
        }
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x10c079);
        std::vector<double,_std::allocator<double>_>::size(in_RSI);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x10c0ad);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x10c0bf);
        std::vector<double_*,_std::allocator<double_*>_>::data
                  ((vector<double_*,_std::allocator<double_*>_> *)0x10c0eb);
        world::D4C((double *)in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,(double *)in_RCX,
                   (double *)CONCAT44(iVar5,in_stack_ffffffffffffffd0),f0_length_00,unaff_retaddr,
                   in_stack_00000008,in_stack_00000010);
        std::vector<double_*,_std::allocator<double_*>_>::~vector
                  ((vector<double_*,_std::allocator<double_*>_> *)in_stack_fffffffffffffed0);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0);
        return true;
      }
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_3c);
      if ((*pvVar3 <= 0.0 && *pvVar3 != 0.0) ||
         (dVar6 = dVar7,
         pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_3c),
         dVar7 < *pvVar3)) break;
      local_3c = local_3c + 1;
      dVar7 = dVar6;
    }
    return false;
  }
  return false;
}

Assistant:

bool AperiodicityExtractionByWorld::Run(
    const std::vector<double>& waveform, const std::vector<double>& f0,
    std::vector<std::vector<double> >* aperiodicity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty() || f0.empty() || NULL == aperiodicity) {
    return false;
  }

  // Check F0 values to prevent segmentation fault.
  const int f0_length(static_cast<int>(f0.size()));
  const double nyquist_frequency(0.5 * sampling_rate_);
  for (int i(0); i < f0_length; ++i) {
    if (f0[i] < 0.0 || nyquist_frequency < f0[i]) {
      return false;
    }
  }

  const double frame_shift_in_sec(frame_shift_ / sampling_rate_);
  std::vector<double> time_axis(f0_length);
  for (int i(0); i < f0_length; ++i) {
    time_axis[i] = i * frame_shift_in_sec;
  }

  world::D4COption option;
  world::InitializeD4COption(&option);
  option.threshold = 0.0;

  // Prepare memories.
  if (aperiodicity->size() != static_cast<std::size_t>(f0_length)) {
    aperiodicity->resize(f0_length);
  }
  const int length(fft_length_ / 2 + 1);
  for (int i(0); i < f0_length; ++i) {
    if ((*aperiodicity)[i].size() != static_cast<std::size_t>(length)) {
      (*aperiodicity)[i].resize(length);
    }
  }

  std::vector<double*> pointers;
  pointers.reserve(f0_length);
  for (std::vector<double>& vector : *aperiodicity) {
    pointers.push_back(vector.data());
  }

  world::D4C(waveform.data(), static_cast<int>(waveform.size()),
             static_cast<int>(sampling_rate_), time_axis.data(), f0.data(),
             f0_length, fft_length_, &option, pointers.data());

  return true;
}